

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace::~IfcPolygonalBoundedHalfSpace
          (IfcPolygonalBoundedHalfSpace *this)

{
  ~IfcPolygonalBoundedHalfSpace
            ((IfcPolygonalBoundedHalfSpace *)&this[-1].super_IfcHalfSpaceSolid.AgreementFlag);
  return;
}

Assistant:

IfcPolygonalBoundedHalfSpace() : Object("IfcPolygonalBoundedHalfSpace") {}